

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O1

void __thiscall
QFontCache::insertEngine(QFontCache *this,Key *key,QFontEngine *engine,bool insertMulti)

{
  byte bVar1;
  int iVar2;
  QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
  *pQVar3;
  Entry *pEVar4;
  long in_FS_OFFSET;
  Engine local_58;
  QFontEngine *local_40;
  TryEmplaceResult local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  LOCK();
  (engine->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (engine->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_40 = engine;
  if (((0x2000 < this->total_cost) &&
      (pQVar3 = (this->engineCache).d.d.ptr,
      pQVar3 != (QMapData<std::multimap<QFontCache::Key,_QFontCache::Engine,_std::less<QFontCache::Key>,_std::allocator<std::pair<const_QFontCache::Key,_QFontCache::Engine>_>_>_>
                 *)0x0)) &&
     (0xff < (long)(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_node_count)) {
    decreaseCache(this);
  }
  local_58.data = local_40;
  local_58.timestamp = this->current_timestamp + 1;
  this->current_timestamp = local_58.timestamp;
  local_58.hits = 0;
  if (insertMulti) {
    QMultiMap<QFontCache::Key,_QFontCache::Engine>::insert(&this->engineCache,key,&local_58);
  }
  else {
    QMultiMap<QFontCache::Key,_QFontCache::Engine>::replace(&this->engineCache,key,&local_58);
  }
  QHash<QFontEngine*,int>::tryEmplace_impl<QFontEngine*const&>
            (&local_38,(QHash<QFontEngine*,int> *)&this->engineCacheCount,&local_40);
  pEVar4 = (local_38.iterator.i.d)->spans[local_38.iterator.i.bucket >> 7].entries;
  bVar1 = (local_38.iterator.i.d)->spans[local_38.iterator.i.bucket >> 7].offsets
          [(uint)local_38.iterator.i.bucket & 0x7f];
  iVar2 = *(int *)(pEVar4[bVar1].storage.data + 8);
  *(int *)(pEVar4[bVar1].storage.data + 8) = iVar2 + 1;
  if (iVar2 == 0) {
    increaseCost(this,local_40->cache_cost);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontCache::insertEngine(const Key &key, QFontEngine *engine, bool insertMulti)
{
    Q_ASSERT(engine != nullptr);
    Q_ASSERT(key.multi == (engine->type() == QFontEngine::Multi));

#ifdef QFONTCACHE_DEBUG
    FC_DEBUG("QFontCache: inserting new engine %p, refcount %d", engine, engine->ref.loadRelaxed());
    if (!insertMulti && engineCache.contains(key)) {
        FC_DEBUG("   QFontCache already contains engine %p for key=(%g %g %d %d %d)",
                 engineCache.value(key).data, key.def.pointSize,
                 key.def.pixelSize, key.def.weight, key.def.style, key.def.fixedPitch);
    }
#endif
    engine->ref.ref();
    // Decrease now rather than waiting
    if (total_cost > min_cost * 2 && engineCache.size() >= QFONTCACHE_DECREASE_TRIGGER_LIMIT)
        decreaseCache();

    Engine data(engine);
    data.timestamp = ++current_timestamp;

    if (insertMulti)
        engineCache.insert(key, data);
    else
        engineCache.replace(key, data);
    // only increase the cost if this is the first time we insert the engine
    if (++engineCacheCount[engine] == 1)
        increaseCost(engine->cache_cost);
}